

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureDescription::FeatureDescription
          (FeatureDescription *this,FeatureDescription *from)

{
  void *pvVar1;
  string *psVar2;
  FeatureType *from_00;
  FeatureType *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureDescription_004272e8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->name_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar2);
  }
  (this->shortdescription_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->shortdescription_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->shortdescription_,psVar2);
  }
  from_00 = from->type_;
  if (from_00 == (FeatureType *)0x0 ||
      from == (FeatureDescription *)&_FeatureDescription_default_instance_) {
    this_00 = (FeatureType *)0x0;
  }
  else {
    this_00 = (FeatureType *)operator_new(0x28);
    FeatureType::FeatureType(this_00,from_00);
  }
  this->type_ = this_00;
  return;
}

Assistant:

FeatureDescription::FeatureDescription(const FeatureDescription& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.name().size() > 0) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  shortdescription_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.shortdescription().size() > 0) {
    shortdescription_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.shortdescription_);
  }
  if (from.has_type()) {
    type_ = new ::CoreML::Specification::FeatureType(*from.type_);
  } else {
    type_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FeatureDescription)
}